

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_not_slow(JSContext *ctx,JSValue *sp)

{
  int iVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  int32_t v1;
  uint local_c;
  
  iVar1 = JS_ToInt32Free(ctx,(int32_t *)&local_c,sp[-1]);
  if (iVar1 == 0) {
    JVar2._0_4_ = ~local_c;
    JVar2._4_4_ = 0;
    sp[-1].u = JVar2;
    iVar3 = 0;
    iVar1 = 0;
  }
  else {
    sp[-1].u.int32 = 0;
    iVar1 = -1;
    iVar3 = 3;
  }
  sp[-1].tag = iVar3;
  return iVar1;
}

Assistant:

static no_inline int js_not_slow(JSContext *ctx, JSValue *sp)
{
    int32_t v1;

    if (unlikely(JS_ToInt32Free(ctx, &v1, sp[-1]))) {
        sp[-1] = JS_UNDEFINED;
        return -1;
    }
    sp[-1] = JS_NewInt32(ctx, ~v1);
    return 0;
}